

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

QRect __thiscall QComboBoxPrivate::popupGeometry(QComboBoxPrivate *this,QPoint *globalPosition)

{
  QWidget *widget;
  bool bVar1;
  QRect QVar2;
  
  widget = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = QStylePrivate::useFullScreenForPopup();
  QWidgetPrivate::screen(widget,globalPosition,true);
  if (bVar1) {
    QVar2 = (QRect)QScreen::geometry();
    return QVar2;
  }
  QVar2 = (QRect)QScreen::availableGeometry();
  return QVar2;
}

Assistant:

QRect QComboBoxPrivate::popupGeometry(const QPoint &globalPosition) const
{
    Q_Q(const QComboBox);
    return QStylePrivate::useFullScreenForPopup()
        ? QWidgetPrivate::screenGeometry(q, globalPosition)
        : QWidgetPrivate::availableScreenGeometry(q, globalPosition);
}